

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_13::NameResolver::VisitModule(NameResolver *this,Module *module)

{
  pointer ppFVar1;
  Func *func;
  pointer ppEVar2;
  pointer ppGVar3;
  ExprVisitor *pEVar4;
  ElemSegment *pEVar5;
  pointer pVVar6;
  pointer ppDVar7;
  DataSegment *pDVar8;
  pointer ppVVar9;
  ulong uVar10;
  ExprVisitor *pEVar11;
  pointer ppDVar12;
  Var *var;
  pointer ppFVar13;
  pointer ppEVar14;
  pointer var_00;
  pointer ppGVar15;
  pointer ppVVar16;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  ExprVisitor *local_40;
  Module *local_38;
  
  this->current_module_ = module;
  CheckDuplicateBindings(this,&module->func_bindings,"function");
  CheckDuplicateBindings(this,&module->global_bindings,"global");
  CheckDuplicateBindings(this,&module->func_type_bindings,"function type");
  CheckDuplicateBindings(this,&module->table_bindings,"table");
  CheckDuplicateBindings(this,&module->memory_bindings,"memory");
  CheckDuplicateBindings(this,&module->except_bindings,"except");
  ppFVar13 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppFVar1 = (module->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = module;
  if (ppFVar13 != ppFVar1) {
    local_40 = &this->visitor_;
    do {
      func = *ppFVar13;
      this->current_func_ = func;
      if ((func->decl).has_func_type == true) {
        ResolveVar(this,&this->current_module_->func_type_bindings,&(func->decl).type_var,
                   "function type");
      }
      pcStack_50 = std::
                   _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/resolve-names.cc:383:7)>
                   ::_M_invoke;
      local_58 = std::
                 _Function_handler<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/resolve-names.cc:383:7)>
                 ::_M_manager;
      local_68._M_unused._0_8_ = (undefined8)func;
      local_68._8_8_ = this;
      BindingHash::FindDuplicates(&func->bindings,(DuplicateCallback *)&local_68);
      if (local_58 != (code *)0x0) {
        (*local_58)(&local_68,&local_68,__destroy_functor);
      }
      ExprVisitor::VisitFunc(local_40,func);
      this->current_func_ = (Func *)0x0;
      ppFVar13 = ppFVar13 + 1;
    } while (ppFVar13 != ppFVar1);
  }
  ppEVar2 = (local_38->exports).super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar14 = (local_38->exports).
                  super__Vector_base<wabt::Export_*,_std::allocator<wabt::Export_*>_>._M_impl.
                  super__Vector_impl_data._M_start; ppEVar14 != ppEVar2; ppEVar14 = ppEVar14 + 1) {
    uVar10 = (ulong)(*ppEVar14)->kind;
    if (uVar10 < 5) {
      ResolveVar(this,(BindingHash *)
                      ((long)&(this->current_module_->loc).filename.data_ +
                      *(long *)(&DAT_011ea128 + uVar10 * 8)),&(*ppEVar14)->var,
                 &DAT_011ea150 + *(int *)(&DAT_011ea150 + uVar10 * 4));
    }
  }
  ppGVar15 = (local_38->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppGVar3 = (local_38->globals).super__Vector_base<wabt::Global_*,_std::allocator<wabt::Global_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppGVar15 != ppGVar3) {
    do {
      ExprVisitor::VisitExprList(&this->visitor_,&(*ppGVar15)->init_expr);
      ppGVar15 = ppGVar15 + 1;
    } while (ppGVar15 != ppGVar3);
  }
  pEVar11 = (ExprVisitor *)
            (local_38->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pEVar4 = (ExprVisitor *)
           (local_38->elem_segments).
           super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pEVar11 != pEVar4) {
    do {
      pEVar5 = (ElemSegment *)
               (((_Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                  *)&pEVar11->delegate_)->_M_impl).super__Vector_impl_data._M_start;
      local_40 = pEVar11;
      ResolveVar(this,&this->current_module_->table_bindings,&pEVar5->table_var,"table");
      ExprVisitor::VisitExprList(&this->visitor_,&pEVar5->offset);
      pVVar6 = (pEVar5->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (var_00 = (pEVar5->vars).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl
                    .super__Vector_impl_data._M_start; var_00 != pVVar6; var_00 = var_00 + 1) {
        ResolveVar(this,&this->current_module_->func_bindings,var_00,"function");
      }
      pEVar11 = (ExprVisitor *)&local_40->state_stack_;
    } while (pEVar11 != pEVar4);
  }
  ppDVar12 = (local_38->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppDVar7 = (local_38->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppDVar12 != ppDVar7) {
    do {
      pDVar8 = *ppDVar12;
      ResolveVar(this,&this->current_module_->memory_bindings,&pDVar8->memory_var,"memory");
      ExprVisitor::VisitExprList(&this->visitor_,&pDVar8->offset);
      ppDVar12 = ppDVar12 + 1;
    } while (ppDVar12 != ppDVar7);
  }
  ppVVar9 = (local_38->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  for (ppVVar16 = (local_38->starts).super__Vector_base<wabt::Var_*,_std::allocator<wabt::Var_*>_>.
                  _M_impl.super__Vector_impl_data._M_start; ppVVar16 != ppVVar9;
      ppVVar16 = ppVVar16 + 1) {
    ResolveVar(this,&this->current_module_->func_bindings,*ppVVar16,"function");
  }
  this->current_module_ = (Module *)0x0;
  return (Result)(this->result_).enum_;
}

Assistant:

Result NameResolver::VisitModule(Module* module) {
  current_module_ = module;
  CheckDuplicateBindings(&module->func_bindings, "function");
  CheckDuplicateBindings(&module->global_bindings, "global");
  CheckDuplicateBindings(&module->func_type_bindings, "function type");
  CheckDuplicateBindings(&module->table_bindings, "table");
  CheckDuplicateBindings(&module->memory_bindings, "memory");
  CheckDuplicateBindings(&module->except_bindings, "except");

  for (Func* func : module->funcs)
    VisitFunc(func);
  for (Export* export_ : module->exports)
    VisitExport(export_);
  for (Global* global : module->globals)
    VisitGlobal(global);
  for (ElemSegment* elem_segment : module->elem_segments)
    VisitElemSegment(elem_segment);
  for (DataSegment* data_segment : module->data_segments)
    VisitDataSegment(data_segment);
  for (Var* start : module->starts)
    ResolveFuncVar(start);
  current_module_ = nullptr;
  return result_;
}